

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::GlobalClockFunction::checkArguments
          (GlobalClockFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  ASTContext *this_01;
  Symbol *pSVar3;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Compilation *in_R8;
  SystemSubroutine *in_R9;
  Compilation *comp;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff58;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff98;
  SyntaxKind typeKind;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bitmask<slang::ast::ASTFlags> local_58;
  SourceLocation scope;
  Compilation *pCVar4;
  DiagCode code_00;
  size_t in_stack_fffffffffffffff8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  typeKind = (SyntaxKind)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  this_00 = ASTContext::getCompilation((ASTContext *)0x1363261);
  callRange.endLoc = in_RSI;
  callRange.startLoc = in_RDX;
  scope = in_RCX;
  pCVar4 = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R9,(ASTContext *)this_00,SUB81((ulong)in_R8 >> 0x38,0),(Args *)in_RCX,
                     callRange,(size_t)in_R8,in_stack_fffffffffffffff8);
  code_00 = SUB84((ulong)pCVar4 >> 0x20,0);
  if (bVar1) {
    this_01 = (ASTContext *)((long)in_RSI + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_58,AllowClockingBlock);
    bVar1 = bitmask<slang::ast::ASTFlags>::has(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x1363378);
      pSVar3 = Compilation::getGlobalClockingAndNoteUse(in_R8,(Scope *)scope);
      if (pSVar3 == (Symbol *)0x0) {
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0x1363398);
        bVar1 = Scope::isUninstantiated
                          ((Scope *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (!bVar1) {
          sourceRange_00.endLoc = in_RCX;
          sourceRange_00.startLoc = in_RDI;
          ASTContext::addDiag(this_01,code_00,sourceRange_00);
        }
        pTVar2 = Compilation::getErrorType(this_00);
      }
      else {
        pTVar2 = Compilation::getType
                           ((Compilation *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),typeKind);
      }
    }
    else {
      sourceRange.endLoc = in_stack_ffffffffffffff78;
      sourceRange.startLoc = in_RDI;
      ASTContext::addDiag(this_01,code,sourceRange);
      pTVar2 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 0))
            return comp.getErrorType();

        if (!context.flags.has(ASTFlags::AllowClockingBlock)) {
            context.addDiag(diag::GlobalClockEventExpr, range);
            return comp.getErrorType();
        }

        if (!comp.getGlobalClockingAndNoteUse(*context.scope)) {
            if (!context.scope->isUninstantiated())
                context.addDiag(diag::NoGlobalClocking, range);
            return comp.getErrorType();
        }

        return comp.getType(SyntaxKind::EventType);
    }